

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddDefinition(void *arg,char *name,char *value)

{
  string_view local_70 [2];
  allocator<char> local_49;
  string local_48;
  void *local_28;
  cmMakefile *mf;
  char *value_local;
  char *name_local;
  void *arg_local;
  
  if (value != (char *)0x0) {
    local_28 = arg;
    mf = (cmMakefile *)value;
    value_local = name;
    name_local = (char *)arg;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_70,(char *)mf);
    cmMakefile::AddDefinition((cmMakefile *)arg,&local_48,local_70[0]);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return;
}

Assistant:

static void CCONV cmAddDefinition(void* arg, const char* name,
                                  const char* value)
{
  if (value) {
    cmMakefile* mf = static_cast<cmMakefile*>(arg);
    mf->AddDefinition(name, value);
  }
}